

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.h
# Opt level: O0

BucketType * __thiscall
Memory::HeapInfo::GetBucket<(Memory::ObjectInfoBits)0>(HeapInfo *this,size_t sizeCat)

{
  uint uVar1;
  BucketType *pBVar2;
  uint bucket;
  size_t sizeCat_local;
  HeapInfo *this_local;
  
  uVar1 = GetBucketIndex(sizeCat);
  pBVar2 = HeapBucketGroup<SmallAllocationBlockAttributes>::GetBucket<(Memory::ObjectInfoBits)0>
                     (this->heapBuckets + uVar1);
  return pBVar2;
}

Assistant:

typename SmallHeapBlockType<attributes, SmallAllocationBlockAttributes>::BucketType&
HeapInfo::GetBucket(size_t sizeCat)
{
    uint bucket = HeapInfo::GetBucketIndex(sizeCat);
    return this->heapBuckets[bucket].GetBucket<attributes>();
}